

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O1

TonkResult tonk_socket_create(TonkSocketConfig *config,TonkSocket *socketOut,TonkJson *errorJsonOut)

{
  TonkResult TVar1;
  int iVar2;
  long lVar3;
  fp_tonk_file_free_t p_Var4;
  long lVar5;
  char *pcVar6;
  
  if (fp_tonk_socket_create == (fp_tonk_socket_create_t)0x0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&FunctionPointerLock);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    pcVar6 = "tonk";
    lVar5 = 0;
    do {
      lVar3 = dlopen(pcVar6,2);
      if (lVar3 != 0) break;
      pcVar6 = kLibrarySearchPaths_64[lVar5 + 1];
      lVar5 = lVar5 + 1;
      lVar3 = 0;
    } while (lVar5 != 0x10);
    fp_tonk_result_to_string = (fp_tonk_result_to_string_t)dlsym(lVar3,"tonk_result_to_string");
    if ((((((fp_tonk_result_to_string == (fp_tonk_result_to_string_t)0x0) ||
           (fp_tonk_socket_create = (fp_tonk_socket_create_t)dlsym(lVar3,"tonk_socket_create"),
           fp_tonk_socket_create == (fp_tonk_socket_create_t)0x0)) ||
          (fp_tonk_advertise = (fp_tonk_advertise_t)dlsym(lVar3,"tonk_advertise"),
          fp_tonk_advertise == (fp_tonk_advertise_t)0x0)) ||
         (((fp_tonk_inject = (fp_tonk_inject_t)dlsym(lVar3,"tonk_inject"),
           fp_tonk_inject == (fp_tonk_inject_t)0x0 ||
           (fp_tonk_socket_destroy = (fp_tonk_socket_destroy_t)dlsym(lVar3,"tonk_socket_destroy"),
           fp_tonk_socket_destroy == (fp_tonk_socket_destroy_t)0x0)) ||
          ((fp_tonk_connect = (fp_tonk_connect_t)dlsym(lVar3,"tonk_connect"),
           fp_tonk_connect == (fp_tonk_connect_t)0x0 ||
           ((fp_tonk_status = (fp_tonk_status_t)dlsym(lVar3,"tonk_status"),
            fp_tonk_status == (fp_tonk_status_t)0x0 ||
            (fp_tonk_status_ex = (fp_tonk_status_ex_t)dlsym(lVar3,"tonk_status_ex"),
            fp_tonk_status_ex == (fp_tonk_status_ex_t)0x0)))))))) ||
        ((fp_tonk_send = (fp_tonk_send_t)dlsym(lVar3,"tonk_send"),
         fp_tonk_send == (fp_tonk_send_t)0x0 ||
         ((((((fp_tonk_flush = (fp_tonk_flush_t)dlsym(lVar3,"tonk_flush"),
              fp_tonk_flush == (fp_tonk_flush_t)0x0 ||
              (fp_tonk_close = (fp_tonk_close_t)dlsym(lVar3,"tonk_close"),
              fp_tonk_close == (fp_tonk_close_t)0x0)) ||
             (fp_tonk_free = (fp_tonk_free_t)dlsym(lVar3,"tonk_free"),
             fp_tonk_free == (fp_tonk_free_t)0x0)) ||
            ((fp_tonk_time = (fp_tonk_time_t)dlsym(lVar3,"tonk_time"),
             fp_tonk_time == (fp_tonk_time_t)0x0 ||
             (fp_tonk_to_remote_time_16 =
                   (fp_tonk_to_remote_time_16_t)dlsym(lVar3,"tonk_to_remote_time_16"),
             fp_tonk_to_remote_time_16 == (fp_tonk_to_remote_time_16_t)0x0)))) ||
           ((fp_tonk_from_local_time_16 =
                  (fp_tonk_from_local_time_16_t)dlsym(lVar3,"tonk_from_local_time_16"),
            fp_tonk_from_local_time_16 == (fp_tonk_from_local_time_16_t)0x0 ||
            ((fp_tonk_to_remote_time_23 =
                   (fp_tonk_to_remote_time_23_t)dlsym(lVar3,"tonk_to_remote_time_23"),
             fp_tonk_to_remote_time_23 == (fp_tonk_to_remote_time_23_t)0x0 ||
             (fp_tonk_from_local_time_23 =
                   (fp_tonk_from_local_time_23_t)dlsym(lVar3,"tonk_from_local_time_23"),
             fp_tonk_from_local_time_23 == (fp_tonk_from_local_time_23_t)0x0)))))) ||
          (fp_tonk_p2p_connect = (fp_tonk_p2p_connect_t)dlsym(lVar3,"tonk_p2p_connect"),
          fp_tonk_p2p_connect == (fp_tonk_p2p_connect_t)0x0)))))) ||
       ((((fp_tonk_set_default_socket_config =
                (fp_tonk_set_default_socket_config_t)dlsym(lVar3,"tonk_set_default_socket_config"),
          fp_tonk_set_default_socket_config == (fp_tonk_set_default_socket_config_t)0x0 ||
          (fp_tonk_file_from_disk = (fp_tonk_file_from_disk_t)dlsym(lVar3,"tonk_file_from_disk"),
          fp_tonk_file_from_disk == (fp_tonk_file_from_disk_t)0x0)) ||
         (fp_tonk_file_from_buffer =
               (fp_tonk_file_from_buffer_t)dlsym(lVar3,"tonk_file_from_buffer"),
         fp_tonk_file_from_buffer == (fp_tonk_file_from_buffer_t)0x0)) ||
        ((fp_tonk_file_send = (fp_tonk_file_send_t)dlsym(lVar3,"tonk_file_send"),
         fp_tonk_file_send == (fp_tonk_file_send_t)0x0 ||
         (fp_tonk_file_receive = (fp_tonk_file_receive_t)dlsym(lVar3,"tonk_file_receive"),
         fp_tonk_file_receive == (fp_tonk_file_receive_t)0x0)))))) {
      pthread_mutex_unlock((pthread_mutex_t *)&FunctionPointerLock);
    }
    else {
      p_Var4 = (fp_tonk_file_free_t)dlsym(lVar3,"tonk_file_free");
      fp_tonk_file_free = p_Var4;
      pthread_mutex_unlock((pthread_mutex_t *)&FunctionPointerLock);
      if (p_Var4 != (fp_tonk_file_free_t)0x0) goto LAB_00105eec;
    }
    if (socketOut != (TonkSocket *)0x0) {
      *socketOut = (TonkSocket)0x0;
    }
    if (errorJsonOut != (TonkJson *)0x0) {
      strncpy(errorJsonOut->JsonString,"{ \"description\": \"Tonk DLL Not Found\" }",0x400);
      errorJsonOut->JsonString[0x3ff] = '\0';
    }
    return Tonk_DLL_Not_Found;
  }
LAB_00105eec:
  TVar1 = (*fp_tonk_socket_create)(config,socketOut,errorJsonOut);
  return TVar1;
}

Assistant:

TonkResult tonk_socket_create(
    const TonkSocketConfig* config, // Configuration for the socket
    TonkSocket*          socketOut, // Created socket, or 0 on failure
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    if (!fp_tonk_socket_create &&
        !LoadTonkLibrary())
    {
        if (socketOut) {
            *socketOut = nullptr;
        }
        if (errorJsonOut) {
            SafeCopyCStr(
                &errorJsonOut->JsonString[0],
                sizeof(TonkJson::JsonString),
                "{ \"description\": \"Tonk DLL Not Found\" }");
        }
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_socket_create(
        config,
        socketOut,
        errorJsonOut);
}